

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

QPlatformMenu * __thiscall
QMenuBarPrivate::findInsertionPlatformMenu(QMenuBarPrivate *this,QAction *action)

{
  long *plVar1;
  QWidget *this_00;
  qsizetype qVar2;
  QPlatformMenu *pQVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QList<QAction_*> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::actions(&local_50,this_00);
  if (local_50.d.size == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    lVar6 = 0;
    do {
      if (local_50.d.size << 3 == lVar6) goto LAB_00466af1;
      lVar4 = lVar4 + 0x100000000;
      plVar1 = (long *)((long)local_50.d.ptr + lVar6);
      lVar6 = lVar6 + 8;
    } while ((QAction *)*plVar1 != action);
    lVar5 = lVar4 >> 0x20;
  }
LAB_00466af1:
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
    }
  }
  do {
    QWidget::actions(&local_50,this_00);
    qVar2 = local_50.d.size;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
      }
    }
    pQVar3 = (QPlatformMenu *)0x0;
    if (qVar2 <= lVar5) break;
    QWidget::actions(&local_50,this_00);
    pQVar3 = getPlatformMenu(this,local_50.d.ptr[lVar5]);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
      }
    }
    lVar5 = lVar5 + 1;
  } while (pQVar3 == (QPlatformMenu *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QPlatformMenu *QMenuBarPrivate::findInsertionPlatformMenu(const QAction *action)
{
    Q_Q(QMenuBar);
    QPlatformMenu *beforeMenu = nullptr;
    for (int beforeIndex = indexOf(const_cast<QAction *>(action)) + 1;
         !beforeMenu && (beforeIndex < q->actions().size());
         ++beforeIndex) {
        beforeMenu = getPlatformMenu(q->actions().at(beforeIndex));
    }

    return beforeMenu;
}